

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

Position __thiscall tli_window_manager::Text::current_position(Text *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar1 = this->index_;
  lVar7 = (long)iVar1;
  iVar2 = this->cursor_position_;
  if (iVar1 < iVar2) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + ((this->buffer_)._M_dataplus._M_p[lVar7] == '\n');
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
    uVar6 = 0;
    if (iVar1 < iVar2) {
      pcVar4 = (this->buffer_)._M_dataplus._M_p + iVar2;
      do {
        if (*pcVar4 == '\n') goto LAB_00104f3a;
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        pcVar4 = pcVar4 + -1;
      } while (iVar2 - iVar1 != uVar5);
      uVar6 = (ulong)(uint)(iVar2 - iVar1);
LAB_00104f3a:
      uVar6 = uVar6 << 0x20;
    }
  }
  else {
    uVar3 = 0;
    uVar6 = 0;
  }
  return (Position)(uVar3 | uVar6);
}

Assistant:

Position Text::current_position() const {
    int row = 0;
    for (int i = index_; i < cursor_position_; ++i) {
        if (buffer_[i] == '\n') {
            ++row;
        }
    }

    int col = 0;
    for (int i = cursor_position_; i > index_; --i) {
        if (buffer_[i] != '\n') {
            ++col;
        } else {
            break;
        }
    }
    return std::make_pair(row, col);
}